

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O2

void __thiscall TPZEqnArray<float>::EndEquation(TPZEqnArray<float> *this)

{
  TPZStack<int,_100>::Push(&this->fEqStart,this->fLastTerm);
  return;
}

Assistant:

void TPZEqnArray<TVar>::EndEquation() {
	fEqStart.Push(fLastTerm);
}